

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task20.cpp
# Opt level: O1

void bubble_sort(int *arr,int size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int __tmp;
  
  if (size != 0) {
    uVar2 = (ulong)(size - 1);
    do {
      if (1 < size) {
        uVar3 = 0;
        do {
          iVar1 = arr[uVar3];
          if (arr[uVar3 + 1] < iVar1) {
            arr[uVar3] = arr[uVar3 + 1];
            arr[uVar3 + 1] = iVar1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      uVar2 = uVar2 - 1;
      size = size + -1;
    } while (size != 0);
  }
  return;
}

Assistant:

void bubble_sort (int* arr, int size){
    for (int unsort_size = size; unsort_size; unsort_size--)
        for (int ind1 = 1, ind2 = 0; ind1 < unsort_size; ind1++, ind2++)
            if (arr[ind2] > arr[ind1]) swap(arr[ind2], arr[ind1]);
}